

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui.cpp
# Opt level: O1

void __thiscall
CUI::DoLabel(CUI *this,CUIRect *pRect,char *pText,float FontSize,int Align,float LineWidth,
            bool MultiLine)

{
  int iVar1;
  CTextCursor *this_00;
  
  if (DoLabel(CUIRect_const*,char_const*,float,int,float,bool)::s_Cursor == '\0') {
    iVar1 = __cxa_guard_acquire(&DoLabel(CUIRect_const*,char_const*,float,int,float,bool)::s_Cursor)
    ;
    if (iVar1 != 0) {
      CTextCursor::CTextCursor(&DoLabel::s_Cursor);
      __cxa_atexit(CTextCursor::~CTextCursor,&DoLabel::s_Cursor,&__dso_handle);
      __cxa_guard_release(&DoLabel(CUIRect_const*,char_const*,float,int,float,bool)::s_Cursor);
    }
  }
  this_00 = &DoLabel::s_Cursor;
  CTextCursor::Reset(&DoLabel::s_Cursor,-1);
  DoLabel::s_Cursor.m_MaxLines = -(uint)MultiLine | 1;
  DoLabel::s_Cursor.m_Flags = (uint)MultiLine << 3;
  DoLabel::s_Cursor.m_FontSize = FontSize;
  DoLabel::s_Cursor.m_MaxWidth = LineWidth;
  ApplyCursorAlign((CUI *)this_00,&DoLabel::s_Cursor,pRect,Align);
  (*(this->m_pTextRender->super_IInterface)._vptr_IInterface[0xb])
            (this->m_pTextRender,&DoLabel::s_Cursor,pText,0xffffffff);
  return;
}

Assistant:

void CUI::DoLabel(const CUIRect *pRect, const char *pText, float FontSize, int Align, float LineWidth, bool MultiLine)
{
	// TODO: FIX ME!!!!
	// Graphics()->BlendNormal();

	static CTextCursor s_Cursor;
	s_Cursor.Reset();
	s_Cursor.m_FontSize = FontSize;
	s_Cursor.m_MaxLines = MultiLine ? -1 : 1;
	s_Cursor.m_MaxWidth = LineWidth;
	s_Cursor.m_Flags = MultiLine ? TEXTFLAG_WORD_WRAP : 0;
	ApplyCursorAlign(&s_Cursor, pRect, Align);

	TextRender()->TextOutlined(&s_Cursor, pText, -1);
}